

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O0

bool pgraph_is_class_dvd(pgraph_state *state)

{
  uint32_t uVar1;
  uint32_t cls;
  pgraph_state *state_local;
  
  uVar1 = pgraph_class(state);
  if ((state->chipset).card_type < 4) {
    state_local._7_1_ = false;
  }
  else if (uVar1 == 0x38) {
    state_local._7_1_ = true;
  }
  else if ((uVar1 == 0x88) && (0xf < (state->chipset).card_type)) {
    state_local._7_1_ = true;
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static inline bool pgraph_is_class_dvd(struct pgraph_state *state) {
	uint32_t cls = pgraph_class(state);
	if (state->chipset.card_type < 4)
		return false;
	if (cls == 0x38)
		return true;
	if (cls == 0x88 && state->chipset.card_type >= 0x10)
		return true;
	return false;
}